

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TtScc(word *pTruth,int nVars)

{
  word wTruth;
  int iVar1;
  int iVar2;
  int local_20;
  int sum;
  int nWords;
  int k;
  int nVars_local;
  word *pTruth_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  local_20 = 0;
  Abc_TtNormalizeSmallTruth(pTruth,nVars);
  for (sum = 0; sum < iVar1; sum = sum + 1) {
    wTruth = pTruth[sum];
    iVar2 = Abc_TtBitCount16(sum);
    iVar2 = Abc_TtScc6(wTruth,iVar2);
    local_20 = iVar2 + local_20;
  }
  return local_20;
}

Assistant:

int Abc_TtScc(word * pTruth, int nVars)
{
    int k, nWords = Abc_TtWordNum(nVars);
    int sum = 0;
    Abc_TtNormalizeSmallTruth(pTruth, nVars);
    for (k = 0; k < nWords; k++)
        sum += Abc_TtScc6(pTruth[k], Abc_TtBitCount16(k));
    return sum;
}